

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_erasure.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  App example;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<App,_0>(&example,(injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                             *)&local_1e0);
  std::function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&)>::operator()
            (&example.drawable.draw,local_180);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==("Square",&local_1e0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_1e0);
    Drawable::~Drawable(&example.drawable);
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return 0;
  }
  __assert_fail("\"Square\" == str.str()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/type_erasure.cpp"
                ,0x2f,"int main()");
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}